

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O2

BlendEq deqp::gles31::Functional::anon_unknown_0::getRandomBlendEq(Random *rng)

{
  deUint32 dVar1;
  
  dVar1 = deRandom_getUint32(&rng->m_rnd);
  return *(BlendEq *)(&DAT_018d95e0 + ((ulong)dVar1 % 5) * 4);
}

Assistant:

BlendEq getRandomBlendEq (de::Random& rng)
{
	const BlendEq eqs[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	return de::getSizedArrayElement<DE_LENGTH_OF_ARRAY(eqs)>(eqs, rng.getUint32() % DE_LENGTH_OF_ARRAY(eqs));
}